

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O0

void __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
buffer_queue(buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int max_size,bool debug)

{
  undefined1 auVar1 [16];
  invalid_argument *this_00;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  bool debug_local;
  int max_size_local;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::mutex::mutex(&this->b_mutex);
  std::condition_variable::condition_variable(&this->b_cond);
  this->b_rcnt = 0;
  this->b_wcnt = 0;
  this->b_debug = false;
  this->b_first = -1;
  this->b_last = -1;
  this->b_size = 0;
  this->capacity = 1000;
  if (max_size < 1) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] max_size is illegal!\n","error","buffer_queue",0x1c);
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"max_size is illegal!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this->b_debug = debug;
  this->capacity = max_size;
  uVar2 = (ulong)this->capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar6 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_60 = pbVar5;
    do {
      std::__cxx11::string::string((string *)local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pbVar5 + uVar2);
  }
  this->b_array = pbVar5;
  return;
}

Assistant:

explicit buffer_queue(int max_size, bool debug=false)
    {
        if (max_size <= 0)
        {
            PR_ERROR("max_size is illegal!\n");
           // exit(-1);
           throw invalid_argument("max_size is illegal!");
        }

        b_debug = debug;
        capacity = max_size;
        b_array = new T[capacity];
    }